

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_window_is_closed(nk_context *ctx,char *name)

{
  nk_window *pnVar1;
  char *in_RSI;
  long in_RDI;
  nk_window *win;
  nk_hash title_hash;
  int title_len;
  nk_hash hash;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar2;
  
  if (in_RDI == 0) {
    uVar2 = 1;
  }
  else {
    nk_strlen(in_RSI);
    hash = (nk_hash)((ulong)in_RDI >> 0x20);
    nk_murmur_hash(ctx,name._4_4_,(nk_hash)name);
    pnVar1 = nk_find_window((nk_context *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),hash,
                            in_RSI);
    if (pnVar1 == (nk_window *)0x0) {
      uVar2 = 1;
    }
    else {
      uVar2 = pnVar1->flags & 0x2000;
    }
  }
  return uVar2;
}

Assistant:

NK_API int
nk_window_is_closed(struct nk_context *ctx, const char *name)
{
    int title_len;
    nk_hash title_hash;
    struct nk_window *win;
    NK_ASSERT(ctx);
    if (!ctx) return 1;

    title_len = (int)nk_strlen(name);
    title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
    win = nk_find_window(ctx, title_hash, name);
    if (!win) return 1;
    return (win->flags & NK_WINDOW_CLOSED);
}